

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_xar.c
# Opt level: O2

void test_write_format_xar(void)

{
  char *pcVar1;
  
  pcVar1 = setlocale(6,"en_US.UTF-8");
  if (pcVar1 != (char *)0x0) {
    test_xar((char *)0x0);
    test_xar("!toc-checksum");
    test_xar("toc-checksum=none");
    test_xar("toc-checksum=sha1");
    test_xar("toc-checksum=md5");
    test_xar("!checksum");
    test_xar("checksum=none");
    test_xar("checksum=sha1");
    test_xar("checksum=md5");
    test_xar("!compression");
    test_xar("compression=none");
    test_xar("compression=gzip");
    test_xar("compression=gzip,compression-level=1");
    test_xar("compression=gzip,compression-level=9");
    test_xar("compression=bzip2");
    test_xar("compression=bzip2,compression-level=1");
    test_xar("compression=bzip2,compression-level=9");
    test_xar("compression=lzma");
    test_xar("compression=lzma,compression-level=1");
    test_xar("compression=lzma,compression-level=9");
    test_xar("compression=xz");
    test_xar("compression=xz,compression-level=1");
    test_xar("compression=xz,compression-level=9");
    return;
  }
  skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_xar.c"
                 ,L'ķ');
  test_skipping("en_US.UTF-8 locale not available on this system.");
  return;
}

Assistant:

DEFINE_TEST(test_write_format_xar)
{
	/* xar mandates the use of UTF-8 XML; if we cannot
	 * use UTF-8, perhaps we should not write xar. */
	if (NULL == setlocale(LC_ALL, "en_US.UTF-8")) {
		skipping("en_US.UTF-8 locale not available on this system.");
		return;
	}

	/* Default mode. */
	test_xar(NULL);

	/* Disable TOC checksum. */
	test_xar("!toc-checksum");
	test_xar("toc-checksum=none");
	/* Specify TOC checksum type to sha1. */
	test_xar("toc-checksum=sha1");
	/* Specify TOC checksum type to md5. */
	test_xar("toc-checksum=md5");

	/* Disable file checksum. */
	test_xar("!checksum");
	test_xar("checksum=none");
	/* Specify file checksum type to sha1. */
	test_xar("checksum=sha1");
	/* Specify file checksum type to md5. */
	test_xar("checksum=md5");

	/* Disable compression. */
	test_xar("!compression");
	test_xar("compression=none");
	/* Specify compression type to gzip. */
	test_xar("compression=gzip");
	test_xar("compression=gzip,compression-level=1");
	test_xar("compression=gzip,compression-level=9");
	/* Specify compression type to bzip2. */
	test_xar("compression=bzip2");
	test_xar("compression=bzip2,compression-level=1");
	test_xar("compression=bzip2,compression-level=9");
	/* Specify compression type to lzma. */
	test_xar("compression=lzma");
	test_xar("compression=lzma,compression-level=1");
	test_xar("compression=lzma,compression-level=9");
	/* Specify compression type to xz. */
	test_xar("compression=xz");
	test_xar("compression=xz,compression-level=1");
	test_xar("compression=xz,compression-level=9");
}